

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

ArenaBlock * __thiscall
google::protobuf::internal::ThreadSafeArena::FirstBlock(ThreadSafeArena *this,void *buf,size_t size)

{
  size_t sVar1;
  string *buf_00;
  ArenaBlock *this_00;
  char *pcVar2;
  char *pcVar3;
  ArenaBlock *extraout_RAX;
  AllocationPolicy *in_RCX;
  size_t size_00;
  undefined1 *puVar4;
  ThreadSafeArena *this_01;
  
  this_01 = (ThreadSafeArena *)&stack0xffffffffffffffd8;
  if (((ulong)buf & 7) == 0) {
    buf_00 = (string *)0x0;
  }
  else {
    buf_00 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,long>
                       ((ulong)buf & 7,0,"reinterpret_cast<uintptr_t>(buf) & 7 == 0u");
  }
  if (buf_00 == (string *)0x0) {
    if (size < 0x11 || buf == (void *)0x0) {
      puVar4 = (anonymous_namespace)::SentryArenaBlock()::kSentryArenaBlock;
    }
    else {
      *(byte *)&(this->alloc_policy_).policy_ = (byte)(this->alloc_policy_).policy_ | 1;
      ArenaBlock::ArenaBlock((ArenaBlock *)buf,(ArenaBlock *)0x0,size);
      puVar4 = (undefined1 *)buf;
    }
    return (ArenaBlock *)puVar4;
  }
  FirstBlock();
  this_01->tag_and_id_ = 0;
  (this_01->alloc_policy_).policy_ = 0;
  (this_01->mutex_).mu_.super___atomic_base<long>._M_i = 0;
  (this_01->head_)._M_b._M_p = (__pointer_type)0x0;
  this_00 = FirstBlock(this_01,buf_00,size_00,in_RCX);
  (this_01->first_arena_).cleanup_list_.prefetch_ptr_ = (char *)0x0;
  (this_01->first_arena_).string_block_._M_b._M_p = (__pointer_type)0x0;
  (this_01->first_arena_).cleanup_list_.next_ = (CleanupNode *)0x0;
  (this_01->first_arena_).cleanup_list_.limit_ = (CleanupNode *)0x0;
  (this_01->first_arena_).prefetch_ptr_ = (char *)0x0;
  (this_01->first_arena_).cleanup_list_.head_ = (Chunk *)0x0;
  (this_01->first_arena_).ptr_._M_b._M_p = (__pointer_type)0x0;
  (this_01->first_arena_).limit_ = (char *)0x0;
  (this_01->first_arena_).string_block_unused_.super___atomic_base<unsigned_long>._M_i = 0;
  (this_01->first_arena_).head_._M_b._M_p = this_00;
  (this_01->first_arena_).space_used_.super___atomic_base<unsigned_long>._M_i = 0;
  sVar1 = this_00->size;
  (this_01->first_arena_).space_allocated_.super___atomic_base<unsigned_long>._M_i = sVar1;
  (this_01->first_arena_).parent_ = this_01;
  (this_01->first_arena_).cached_block_length_ = '\0';
  (this_01->first_arena_).cached_blocks_ = (CachedBlock **)0x0;
  if (sVar1 != 0) {
    pcVar2 = ArenaBlock::Pointer(this_00,0x10);
    pcVar3 = ArenaBlock::Pointer(this_00,this_00->size & 0xfffffffffffffff8);
    (this_01->first_arena_).ptr_._M_b._M_p = pcVar2;
    (this_01->first_arena_).prefetch_ptr_ = pcVar2;
    (this_01->first_arena_).limit_ = pcVar3;
  }
  InitializeWithPolicy(this_01,in_RCX);
  return extraout_RAX;
}

Assistant:

ArenaBlock* ThreadSafeArena::FirstBlock(void* buf, size_t size) {
  ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(buf) & 7, 0u);
  if (buf == nullptr || size <= kBlockHeaderSize) {
    return SentryArenaBlock();
  }
  // Record user-owned block.
  alloc_policy_.set_is_user_owned_initial_block(true);
  return new (buf) ArenaBlock{nullptr, size};
}